

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

_func_DescriptorDatabaseTestCase_ptr ** __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
::Iterator::Current(Iterator *this)

{
  pointer pp_Var1;
  reference pp_Var2;
  Iterator *this_local;
  
  pp_Var1 = std::
            unique_ptr<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
            ::get(&this->value_);
  if (pp_Var1 == (pointer)0x0) {
    pp_Var1 = (pointer)operator_new(8);
    pp_Var2 = __gnu_cxx::
              __normal_iterator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const_*)(),_std::vector<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)(),_std::allocator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>_>_>
              ::operator*(&this->iterator_);
    *pp_Var1 = *pp_Var2;
    std::
    unique_ptr<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
    ::reset(&this->value_,pp_Var1);
  }
  pp_Var1 = std::
            unique_ptr<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)(),_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*const)()>_>
            ::get(&this->value_);
  return pp_Var1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }